

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O1

void lj_cconv_ct_tv(CTState *cts,CType *d,uint8_t *dp,TValue *o,CTInfo flags)

{
  ushort uVar1;
  CTypeID CVar2;
  CType *pCVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  GCstr *name;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  TValue sp;
  void *tmpptr;
  CTSize ofs;
  ulong *local_48;
  TValue local_40;
  CTSize local_34;
  
  uVar8 = (o->field_2).it;
  if (uVar8 < 0xfffeffff) {
    flags = flags | 2;
    uVar7 = 0xe;
    sp = (TValue)o;
    goto LAB_00150b54;
  }
  switch(uVar8) {
  case 0xfffffff3:
    local_48 = (ulong *)((ulong)(o->u32).lo + 0x18);
    uVar7 = 0x11;
    sp.u64 = (uint64_t)&local_48;
    if (*(char *)((ulong)(o->u32).lo + 6) == '\x01') {
      local_48 = (ulong *)*local_48;
      sp.u64 = (uint64_t)&local_48;
    }
    break;
  case 0xfffffff4:
    uVar8 = d->info >> 0x1c;
    if (uVar8 == 1) {
      uVar8 = (o->u32).lo;
      local_48 = (ulong *)((ulong)local_48 & 0xffffffff00000000);
      memset(dp,0,(ulong)d->size);
      cconv_substruct_tab(cts,d,dp,(GCtab *)(ulong)uVar8,(int32_t *)&local_48,flags);
      return;
    }
    if (uVar8 == 3) {
      cconv_array_tab(cts,d,dp,(GCtab *)(ulong)(o->u32).lo,flags);
      return;
    }
LAB_00150ea9:
    cconv_err_convtv(cts,d,o,flags);
  case 0xfffffff5:
    uVar1 = *(ushort *)((ulong)(o->u32).lo + 6);
    uVar8 = (uint)uVar1;
    sp.u64 = (ulong)(o->u32).lo + 8;
    pCVar3 = cts->tab;
    if ((pCVar3[uVar1].info & 0xf0800000) == 0x20800000) {
      sp.u64 = *sp.u64;
      uVar8 = pCVar3[uVar1].info & 0xffff;
    }
    uVar7 = (ulong)uVar8 * 0x10;
    uVar9 = pCVar3[uVar8].info >> 0x1c;
    if (uVar9 == 5) {
      uVar7 = (ulong)((pCVar3[uVar8].info & 0xffff) << 4);
    }
    else if (uVar9 == 6) {
      CVar2 = lj_ctype_intern(cts,uVar8 | 0x20030000,8);
      uVar7 = (ulong)CVar2;
      d = (CType *)((long)&cts->tab->info + ((long)d - (long)pCVar3 & 0xffffffff0U));
      break;
    }
    pCVar3 = (CType *)((long)&pCVar3->info + uVar7);
    goto LAB_00150b5d;
  default:
    if ((uVar8 & 0xffff8000) != 0xffff0000) {
      if ((uVar8 == 0xfffffff7) &&
         (pvVar4 = lj_ccallback_new(cts,d,(GCfunc *)(ulong)(o->u32).lo), pvVar4 != (void *)0x0)) {
        *(void **)dp = pvVar4;
        return;
      }
      goto LAB_00150ea9;
    }
    local_48 = (ulong *)(o->u64 & 0x7fffffffff |
                        (ulong)*(uint *)((ulong)(cts->g->gc).lightudseg.ptr32 +
                                        (o->u64 >> 0x27 & 0xff) * 4) << 0x20);
    goto LAB_00150c86;
  case 0xfffffffb:
    name = (GCstr *)(ulong)(o->u32).lo;
    if ((d->info & 0xf0000000) == 0x50000000) {
      pCVar3 = lj_ctype_getfieldq(cts,d,name,&local_34,(CTInfo *)0x0);
      uVar7 = 0x11;
      iVar6 = 3;
      local_40.u64 = (uint64_t)&local_48;
      if ((pCVar3 != (CType *)0x0) &&
         (local_40.u64 = (uint64_t)&local_48, (pCVar3->info & 0xf0000000) == 0xb0000000)) {
        uVar7 = (ulong)(pCVar3->info & 0xffff);
        iVar6 = 0;
        local_40 = (TValue)&pCVar3->size;
      }
    }
    else if ((d->info & 0xfc000000) == 0x30000000) {
      uVar1 = (ushort)d->info;
      uVar7 = 0x11;
      iVar6 = 3;
      local_40.u64 = (uint64_t)&local_48;
      if ((cts->tab[uVar1].info < 0x4000000) &&
         (local_40.u64 = (uint64_t)&local_48, cts->tab[uVar1].size == 1)) {
        uVar5 = name->len + 1;
        uVar8 = d->size;
        uVar9 = uVar5;
        if (uVar8 < uVar5) {
          uVar9 = uVar8;
        }
        if (uVar8 == 0) {
          uVar9 = uVar5;
        }
        local_40.u64 = (uint64_t)&local_48;
        memcpy(dp,name + 1,(ulong)uVar9);
        iVar6 = 1;
      }
    }
    else {
      local_40.u64 = (uint64_t)(name + 1);
      flags = flags | 2;
      uVar7 = 0x14;
      iVar6 = 0;
    }
    sp = local_40;
    if (iVar6 != 0) {
      if (iVar6 != 3) {
        return;
      }
      goto LAB_00150ea9;
    }
    break;
  case 0xfffffffd:
  case 0xfffffffe:
    local_48 = (ulong *)CONCAT71(local_48._1_7_,-2 - (char)uVar8);
    uVar7 = 3;
    sp.u64 = (uint64_t)&local_48;
    break;
  case 0xffffffff:
    local_48 = (ulong *)0x0;
    flags = flags | 2;
LAB_00150c86:
    uVar7 = 0x11;
    sp.u64 = (uint64_t)&local_48;
  }
LAB_00150b54:
  pCVar3 = cts->tab + uVar7;
LAB_00150b5d:
  if ((d->info & 0xf0000000) == 0x50000000) {
    d = (CType *)((long)&cts->tab->info + (ulong)((d->info & 0xffff) << 4));
  }
  lj_cconv_ct_ct(cts,d,pCVar3,dp,(uint8_t *)sp,flags);
  return;
}

Assistant:

void lj_cconv_ct_tv(CTState *cts, CType *d,
		    uint8_t *dp, TValue *o, CTInfo flags)
{
  CTypeID sid = CTID_P_VOID;
  CType *s;
  void *tmpptr;
  uint8_t tmpbool, *sp = (uint8_t *)&tmpptr;
  if (LJ_LIKELY(tvisint(o))) {
    sp = (uint8_t *)&o->i;
    sid = CTID_INT32;
    flags |= CCF_FROMTV;
  } else if (LJ_LIKELY(tvisnum(o))) {
    sp = (uint8_t *)&o->n;
    sid = CTID_DOUBLE;
    flags |= CCF_FROMTV;
  } else if (tviscdata(o)) {
    sp = cdataptr(cdataV(o));
    sid = cdataV(o)->ctypeid;
    s = ctype_get(cts, sid);
    if (ctype_isref(s->info)) {  /* Resolve reference for value. */
      lj_assertCTS(s->size == CTSIZE_PTR, "ref is not pointer-sized");
      sp = *(void **)sp;
      sid = ctype_cid(s->info);
    }
    s = ctype_raw(cts, sid);
    if (ctype_isfunc(s->info)) {
      CTypeID did = ctype_typeid(cts, d);
      sid = lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|sid), CTSIZE_PTR);
      d = ctype_get(cts, did);  /* cts->tab may have been reallocated. */
    } else {
      if (ctype_isenum(s->info)) s = ctype_child(cts, s);
      goto doconv;
    }
  } else if (tvisstr(o)) {
    GCstr *str = strV(o);
    if (ctype_isenum(d->info)) {  /* Match string against enum constant. */
      CTSize ofs;
      CType *cct = lj_ctype_getfield(cts, d, str, &ofs);
      if (!cct || !ctype_isconstval(cct->info))
	goto err_conv;
      lj_assertCTS(d->size == 4, "only 32 bit enum supported");  /* NYI */
      sp = (uint8_t *)&cct->size;
      sid = ctype_cid(cct->info);
    } else if (ctype_isrefarray(d->info)) {  /* Copy string to array. */
      CType *dc = ctype_rawchild(cts, d);
      CTSize sz = str->len+1;
      if (!ctype_isinteger(dc->info) || dc->size != 1)
	goto err_conv;
      if (d->size != 0 && d->size < sz)
	sz = d->size;
      memcpy(dp, strdata(str), sz);
      return;
    } else {  /* Otherwise pass it as a const char[]. */
      sp = (uint8_t *)strdata(str);
      sid = CTID_A_CCHAR;
      flags |= CCF_FROMTV;
    }
  } else if (tvistab(o)) {
    if (ctype_isarray(d->info)) {
      cconv_array_tab(cts, d, dp, tabV(o), flags);
      return;
    } else if (ctype_isstruct(d->info)) {
      cconv_struct_tab(cts, d, dp, tabV(o), flags);
      return;
    } else {
      goto err_conv;
    }
  } else if (tvisbool(o)) {
    tmpbool = boolV(o);
    sp = &tmpbool;
    sid = CTID_BOOL;
  } else if (tvisnil(o)) {
    tmpptr = (void *)0;
    flags |= CCF_FROMTV;
  } else if (tvisudata(o)) {
    GCudata *ud = udataV(o);
    tmpptr = uddata(ud);
    if (ud->udtype == UDTYPE_IO_FILE)
      tmpptr = *(void **)tmpptr;
  } else if (tvislightud(o)) {
    tmpptr = lightudV(cts->g, o);
  } else if (tvisfunc(o)) {
    void *p = lj_ccallback_new(cts, d, funcV(o));
    if (p) {
      *(void **)dp = p;
      return;
    }
    goto err_conv;
  } else {
  err_conv:
    cconv_err_convtv(cts, d, o, flags);
  }
  s = ctype_get(cts, sid);
doconv:
  if (ctype_isenum(d->info)) d = ctype_child(cts, d);
  lj_cconv_ct_ct(cts, d, s, dp, sp, flags);
}